

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall cfd::core::HDWallet::HDWallet(HDWallet *this)

{
  allocator local_31;
  string local_30;
  HDWallet *local_10;
  HDWallet *this_local;
  
  local_10 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_30,
             "00000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,&local_31);
  ByteData::ByteData(&this->seed_,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

HDWallet::HDWallet() : seed_(ByteData(kEmptySeedStr)) {
  // do nothing
}